

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int ConnectP33xx(P33X *pP33x,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsP33x[lVar2] == (void *)0x0) {
      iVar1 = ConnectP33x(pP33x,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsP33x[lVar2] = pP33x;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectP33xx(P33X* pP33x, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsP33x[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectP33x(pP33x, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsP33x[id] = pP33x;

	return EXIT_SUCCESS;
}